

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

void __thiscall Bmp::save(Bmp *this,string *file)

{
  char *__filename;
  FILE *__s;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int j;
  FILE *f;
  string *file_local;
  Bmp *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __s = fopen(__filename,"wb");
  fwrite(&this->m_bf,1,0xe,__s);
  fwrite(&this->m_bi,1,0x28,__s);
  i_1 = this->m_h;
  while (i_1 = i_1 + -1, -1 < i_1) {
    for (local_28 = 0; local_28 < this->m_w; local_28 = local_28 + 1) {
      fwrite(&this->m_data[local_28][i_1].b,1,1,__s);
      fwrite(&this->m_data[local_28][i_1].g,1,1,__s);
      fwrite(this->m_data[local_28] + i_1,1,1,__s);
    }
    for (local_2c = 0; local_2c < this->m_w % 4; local_2c = local_2c + 1) {
      fputc(0,__s);
    }
  }
  fclose(__s);
  return;
}

Assistant:

void Bmp::save(const std::string& file) const
{
    FILE* f = fopen(file.c_str(), "wb");

    fwrite(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fwrite(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);
    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fwrite(&m_data[i][j].b, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].g, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fputc(0, f);
    }

    fclose(f);
}